

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O2

c_int update_linsys_solver_matrices_qdldl(qdldl_solver *s,csc *P,csc *A)

{
  csc *pcVar1;
  csc *pcVar2;
  ulong uVar3;
  
  update_KKT_P(s->KKT,P,s->PtoKKT,s->sigma,s->Pdiag_idx,s->Pdiag_n);
  update_KKT_A(s->KKT,A,s->AtoKKT);
  pcVar1 = s->KKT;
  pcVar2 = s->L;
  uVar3 = QDLDL_factor(pcVar1->n,pcVar1->p,pcVar1->i,pcVar1->x,pcVar2->p,pcVar2->i,pcVar2->x,s->D,
                       s->Dinv,s->Lnz,s->etree,s->bwork,s->iwork,s->fwork);
  return uVar3 >> 0x3f;
}

Assistant:

c_int update_linsys_solver_matrices_qdldl(qdldl_solver * s, const csc *P, const csc *A) {

    // Update KKT matrix with new P
    update_KKT_P(s->KKT, P, s->PtoKKT, s->sigma, s->Pdiag_idx, s->Pdiag_n);

    // Update KKT matrix with new A
    update_KKT_A(s->KKT, A, s->AtoKKT);

    return (QDLDL_factor(s->KKT->n, s->KKT->p, s->KKT->i, s->KKT->x,
        s->L->p, s->L->i, s->L->x, s->D, s->Dinv, s->Lnz,
        s->etree, s->bwork, s->iwork, s->fwork) < 0);

}